

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv6Transmitter::Poll(RTPUDPv6Transmitter *this)

{
  int iVar1;
  
  iVar1 = -0x72;
  if ((this->init == true) && (iVar1 = -0x71, this->created == true)) {
    iVar1 = PollSocket(this,true);
    if (-1 < iVar1) {
      iVar1 = PollSocket(this,false);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::Poll()
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	int status;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	status = PollSocket(true); // poll RTP socket
	if (status >= 0)
		status = PollSocket(false); // poll RTCP socket
	MAINMUTEX_UNLOCK
	return status;
}